

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O1

int __thiscall
ncnn::BinaryOp_x86::forward
          (BinaryOp_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int *piVar1;
  int _h;
  int _d;
  uint _c;
  uint _elempack;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  int iVar26;
  int iVar27;
  size_t sVar28;
  uint uVar29;
  Option *pOVar30;
  Mat *pMVar31;
  Mat *a;
  Option *in_R8;
  Mat *pMVar32;
  Option *_elemsize;
  Option *pOVar33;
  Mat local_138;
  ulong local_f0;
  Mat local_e8;
  Mat local_98;
  Mat *local_48;
  Option *local_40;
  BinaryOp_x86 *local_38;
  
  pMVar32 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar29 = pMVar32[1].dims;
  if (pMVar32[1].dims < pMVar32->dims) {
    uVar29 = pMVar32->dims;
  }
  local_f0 = (ulong)uVar29;
  local_e8.data = pMVar32->data;
  piVar1 = pMVar32->refcount;
  local_e8.refcount._0_4_ = SUB84(piVar1,0);
  local_e8.refcount._4_4_ = (undefined4)((ulong)piVar1 >> 0x20);
  local_e8.elemsize = pMVar32->elemsize;
  local_e8.elempack = pMVar32->elempack;
  local_e8.allocator = pMVar32->allocator;
  local_e8.dims = pMVar32->dims;
  local_e8.w = pMVar32->w;
  local_e8.h = pMVar32->h;
  local_e8.d = pMVar32->d;
  local_e8.c = pMVar32->c;
  local_e8.cstep = pMVar32->cstep;
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  local_98.data = pMVar32[1].data;
  piVar1 = pMVar32[1].refcount;
  local_98.refcount._0_4_ = SUB84(piVar1,0);
  local_98.refcount._4_4_ = (undefined4)((ulong)piVar1 >> 0x20);
  local_98.elemsize._0_4_ = (undefined4)pMVar32[1].elemsize;
  local_98.elemsize._4_4_ = (undefined4)(pMVar32[1].elemsize >> 0x20);
  local_98.elempack = pMVar32[1].elempack;
  local_98.allocator = pMVar32[1].allocator;
  local_98.dims = pMVar32[1].dims;
  local_98.w = pMVar32[1].w;
  local_98.h = pMVar32[1].h;
  local_98.d = pMVar32[1].d;
  local_98.c = pMVar32[1].c;
  local_98.cstep = pMVar32[1].cstep;
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  if (pMVar32->dims < (int)uVar29) {
    if (uVar29 == 2) {
      sVar28 = (long)pMVar32->elempack * (long)pMVar32->w;
      iVar27 = (int)sVar28;
      if (iVar27 == pMVar32[1].elempack * pMVar32[1].h) {
        in_R8 = (Option *)opt->workspace_allocator;
        Mat::reshape(&local_138,pMVar32,1,pMVar32->w,(Allocator *)in_R8);
        piVar1 = (int *)CONCAT44(local_138.refcount._4_4_,local_138.refcount._0_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        piVar1 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            if (local_e8.allocator == (Allocator *)0x0) {
              if (local_e8.data != (void *)0x0) {
                free(local_e8.data);
              }
            }
            else {
              (*(local_e8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        piVar1 = (int *)CONCAT44(local_138.refcount._4_4_,local_138.refcount._0_4_);
        local_e8.data = local_138.data;
        local_e8.refcount._0_4_ = local_138.refcount._0_4_;
        local_e8.refcount._4_4_ = local_138.refcount._4_4_;
        local_e8.elemsize._0_4_ = (undefined4)local_138.elemsize;
        local_e8.elemsize._4_4_ = local_138.elemsize._4_4_;
        local_e8.elempack = local_138.elempack;
        local_e8.allocator = local_138.allocator;
        uVar22._0_4_ = local_138.dims;
        uVar22._4_4_ = local_138.w;
        local_e8.dims = local_138.dims;
        local_e8.w = local_138.w;
        uVar24._0_4_ = local_138.h;
        uVar24._4_4_ = local_138.d;
        local_e8.h = local_138.h;
        local_e8.d = local_138.d;
        local_e8.c = local_138.c;
        local_e8.cstep = local_138.cstep;
        uVar23 = uVar22;
        uVar25 = uVar24;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          uVar23 = local_e8._40_8_;
          uVar25 = local_e8._48_8_;
          if (*piVar1 == 0) {
            if (local_138.allocator == (Allocator *)0x0) {
              if (local_138.data != (void *)0x0) {
                local_e8._40_8_ = uVar22;
                local_e8._48_8_ = uVar24;
                free(local_138.data);
                uVar23 = local_e8._40_8_;
                uVar25 = local_e8._48_8_;
              }
            }
            else {
              local_e8._40_8_ = uVar22;
              local_e8._48_8_ = uVar24;
              (*(local_138.allocator)->_vptr_Allocator[3])();
              uVar23 = local_e8._40_8_;
              uVar25 = local_e8._48_8_;
            }
          }
        }
        local_e8._48_8_ = uVar25;
        local_e8._40_8_ = uVar23;
        local_138.cstep = 0;
        local_138.data = (void *)0x0;
        local_138.refcount._0_4_ = 0;
        local_138.refcount._4_4_ = 0;
        local_138.elemsize._0_4_ = 0;
        local_138.elemsize._4_4_ = 0;
        local_138.elempack = 0;
        local_138.dims = 0;
        local_138.w = 0;
        local_138.h = 0;
        local_138.d = 0;
        local_138.c = 0;
      }
      else {
        local_e8.w = iVar27;
        local_e8.dims = 2;
        local_e8.elempack = 1;
        local_e8.elemsize = pMVar32->elemsize / (ulong)(long)pMVar32->elempack;
        local_e8.cstep = sVar28;
      }
      uVar29 = (uint)local_f0;
    }
    if ((uVar29 == 3) && (pMVar32->dims == 1)) {
      sVar28 = (long)pMVar32->elempack * (long)pMVar32->w;
      iVar27 = (int)sVar28;
      if (iVar27 == pMVar32[1].elempack * pMVar32[1].c) {
        in_R8 = (Option *)(ulong)(uint)pMVar32->w;
        Mat::reshape(&local_138,pMVar32,1,1,pMVar32->w,opt->workspace_allocator);
        piVar1 = (int *)CONCAT44(local_138.refcount._4_4_,local_138.refcount._0_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        piVar1 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            if (local_e8.allocator == (Allocator *)0x0) {
              if (local_e8.data != (void *)0x0) {
                free(local_e8.data);
              }
            }
            else {
              (*(local_e8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        piVar1 = (int *)CONCAT44(local_138.refcount._4_4_,local_138.refcount._0_4_);
        local_e8.data = local_138.data;
        local_e8.refcount._0_4_ = local_138.refcount._0_4_;
        local_e8.refcount._4_4_ = local_138.refcount._4_4_;
        local_e8.elemsize._0_4_ = (undefined4)local_138.elemsize;
        local_e8.elemsize._4_4_ = local_138.elemsize._4_4_;
        local_e8.elempack = local_138.elempack;
        local_e8.allocator = local_138.allocator;
        uVar23._0_4_ = local_138.dims;
        uVar23._4_4_ = local_138.w;
        local_e8.dims = local_138.dims;
        local_e8.w = local_138.w;
        uVar25._0_4_ = local_138.h;
        uVar25._4_4_ = local_138.d;
        local_e8.h = local_138.h;
        local_e8.d = local_138.d;
        local_e8.c = local_138.c;
        local_e8.cstep = local_138.cstep;
        uVar22 = uVar23;
        uVar24 = uVar25;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          uVar22 = local_e8._40_8_;
          uVar24 = local_e8._48_8_;
          if (*piVar1 == 0) {
            if (local_138.allocator == (Allocator *)0x0) {
              if (local_138.data != (void *)0x0) {
                local_e8._40_8_ = uVar23;
                local_e8._48_8_ = uVar25;
                free(local_138.data);
                uVar22 = local_e8._40_8_;
                uVar24 = local_e8._48_8_;
              }
            }
            else {
              local_e8._40_8_ = uVar23;
              local_e8._48_8_ = uVar25;
              (*(local_138.allocator)->_vptr_Allocator[3])();
              uVar22 = local_e8._40_8_;
              uVar24 = local_e8._48_8_;
            }
          }
        }
        local_e8._48_8_ = uVar24;
        local_e8._40_8_ = uVar22;
        local_138.cstep = 0;
        local_138.data = (void *)0x0;
        local_138.refcount._0_4_ = 0;
        local_138.refcount._4_4_ = 0;
        local_138.elemsize._0_4_ = 0;
        local_138.elemsize._4_4_ = 0;
        local_138.elempack = 0;
        local_138.dims = 0;
        local_138.w = 0;
        local_138.h = 0;
        local_138.d = 0;
        local_138.c = 0;
      }
      else {
        local_e8.w = iVar27;
        local_e8.dims = 3;
        local_e8.elempack = 1;
        local_e8.elemsize = pMVar32->elemsize / (ulong)(long)pMVar32->elempack;
        local_e8.cstep = sVar28;
      }
      uVar29 = (uint)local_f0;
    }
    if ((uVar29 == 3) && (pMVar32->dims == 2)) {
      in_R8 = (Option *)(ulong)(uint)pMVar32->h;
      Mat::reshape(&local_138,pMVar32,1,pMVar32->w,pMVar32->h,opt->workspace_allocator);
      piVar1 = (int *)CONCAT44(local_138.refcount._4_4_,local_138.refcount._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      piVar1 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (local_e8.allocator == (Allocator *)0x0) {
            if (local_e8.data != (void *)0x0) {
              free(local_e8.data);
            }
          }
          else {
            (*(local_e8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar1 = (int *)CONCAT44(local_138.refcount._4_4_,local_138.refcount._0_4_);
      local_e8.data = local_138.data;
      local_e8.refcount._0_4_ = local_138.refcount._0_4_;
      local_e8.refcount._4_4_ = local_138.refcount._4_4_;
      local_e8.elemsize._0_4_ = (undefined4)local_138.elemsize;
      local_e8.elemsize._4_4_ = local_138.elemsize._4_4_;
      local_e8.elempack = local_138.elempack;
      local_e8.allocator = local_138.allocator;
      uVar2._0_4_ = local_138.dims;
      uVar2._4_4_ = local_138.w;
      local_e8.dims = local_138.dims;
      local_e8.w = local_138.w;
      uVar3._0_4_ = local_138.h;
      uVar3._4_4_ = local_138.d;
      local_e8.h = local_138.h;
      local_e8.d = local_138.d;
      local_e8.c = local_138.c;
      local_e8.cstep = local_138.cstep;
      uVar22 = uVar2;
      uVar24 = uVar3;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        uVar22 = local_e8._40_8_;
        uVar24 = local_e8._48_8_;
        if (*piVar1 == 0) {
          if (local_138.allocator == (Allocator *)0x0) {
            if (local_138.data != (void *)0x0) {
              local_e8._40_8_ = uVar2;
              local_e8._48_8_ = uVar3;
              free(local_138.data);
              uVar22 = local_e8._40_8_;
              uVar24 = local_e8._48_8_;
            }
          }
          else {
            local_e8._40_8_ = uVar2;
            local_e8._48_8_ = uVar3;
            (*(local_138.allocator)->_vptr_Allocator[3])();
            uVar22 = local_e8._40_8_;
            uVar24 = local_e8._48_8_;
          }
        }
      }
      local_e8._48_8_ = uVar24;
      local_e8._40_8_ = uVar22;
      local_138.cstep = 0;
      local_138.data = (void *)0x0;
      local_138.refcount._0_4_ = 0;
      local_138.refcount._4_4_ = 0;
      local_138.elemsize._0_4_ = 0;
      local_138.elemsize._4_4_ = 0;
      local_138.elempack = 0;
      local_138.dims = 0;
      local_138.w = 0;
      local_138.h = 0;
      local_138.d = 0;
      local_138.c = 0;
      uVar29 = (uint)local_f0;
    }
    if ((uVar29 == 4) && (pMVar32->dims == 1)) {
      sVar28 = (long)pMVar32->elempack * (long)pMVar32->w;
      iVar27 = (int)sVar28;
      if (iVar27 == pMVar32[1].elempack * pMVar32[1].c) {
        in_R8 = (Option *)0x1;
        Mat::reshape(&local_138,pMVar32,1,1,1,pMVar32->w,opt->workspace_allocator);
        piVar1 = (int *)CONCAT44(local_138.refcount._4_4_,local_138.refcount._0_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        piVar1 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            if (local_e8.allocator == (Allocator *)0x0) {
              if (local_e8.data != (void *)0x0) {
                free(local_e8.data);
              }
            }
            else {
              (*(local_e8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        piVar1 = (int *)CONCAT44(local_138.refcount._4_4_,local_138.refcount._0_4_);
        local_e8.data = local_138.data;
        local_e8.refcount._0_4_ = local_138.refcount._0_4_;
        local_e8.refcount._4_4_ = local_138.refcount._4_4_;
        local_e8.elemsize._0_4_ = (undefined4)local_138.elemsize;
        local_e8.elemsize._4_4_ = local_138.elemsize._4_4_;
        local_e8.elempack = local_138.elempack;
        local_e8.allocator = local_138.allocator;
        uVar4._0_4_ = local_138.dims;
        uVar4._4_4_ = local_138.w;
        local_e8.dims = local_138.dims;
        local_e8.w = local_138.w;
        uVar5._0_4_ = local_138.h;
        uVar5._4_4_ = local_138.d;
        local_e8.h = local_138.h;
        local_e8.d = local_138.d;
        local_e8.c = local_138.c;
        local_e8.cstep = local_138.cstep;
        uVar22 = uVar4;
        uVar24 = uVar5;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          uVar22 = local_e8._40_8_;
          uVar24 = local_e8._48_8_;
          if (*piVar1 == 0) {
            if (local_138.allocator == (Allocator *)0x0) {
              if (local_138.data != (void *)0x0) {
                local_e8._40_8_ = uVar4;
                local_e8._48_8_ = uVar5;
                free(local_138.data);
                uVar22 = local_e8._40_8_;
                uVar24 = local_e8._48_8_;
              }
            }
            else {
              local_e8._40_8_ = uVar4;
              local_e8._48_8_ = uVar5;
              (*(local_138.allocator)->_vptr_Allocator[3])();
              uVar22 = local_e8._40_8_;
              uVar24 = local_e8._48_8_;
            }
          }
        }
        local_e8._48_8_ = uVar24;
        local_e8._40_8_ = uVar22;
        local_138.cstep = 0;
        local_138.data = (void *)0x0;
        local_138.refcount._0_4_ = 0;
        local_138.refcount._4_4_ = 0;
        local_138.elemsize._0_4_ = 0;
        local_138.elemsize._4_4_ = 0;
        local_138.elempack = 0;
        local_138.dims = 0;
        local_138.w = 0;
        local_138.h = 0;
        local_138.d = 0;
        local_138.c = 0;
      }
      else {
        local_e8.w = iVar27;
        local_e8.dims = 4;
        local_e8.elempack = 1;
        local_e8.elemsize = pMVar32->elemsize / (ulong)(long)pMVar32->elempack;
        local_e8.cstep = sVar28;
      }
      uVar29 = (uint)local_f0;
    }
    if ((uVar29 == 4) && (pMVar32->dims == 2)) {
      in_R8 = (Option *)(ulong)(uint)pMVar32->w;
      Mat::reshape(&local_138,pMVar32,1,1,pMVar32->w,pMVar32->h,opt->workspace_allocator);
      piVar1 = (int *)CONCAT44(local_138.refcount._4_4_,local_138.refcount._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      piVar1 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (local_e8.allocator == (Allocator *)0x0) {
            if (local_e8.data != (void *)0x0) {
              free(local_e8.data);
            }
          }
          else {
            (*(local_e8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar1 = (int *)CONCAT44(local_138.refcount._4_4_,local_138.refcount._0_4_);
      local_e8.data = local_138.data;
      local_e8.refcount._0_4_ = local_138.refcount._0_4_;
      local_e8.refcount._4_4_ = local_138.refcount._4_4_;
      local_e8.elemsize._0_4_ = (undefined4)local_138.elemsize;
      local_e8.elemsize._4_4_ = local_138.elemsize._4_4_;
      local_e8.elempack = local_138.elempack;
      local_e8.allocator = local_138.allocator;
      uVar6._0_4_ = local_138.dims;
      uVar6._4_4_ = local_138.w;
      local_e8.dims = local_138.dims;
      local_e8.w = local_138.w;
      uVar7._0_4_ = local_138.h;
      uVar7._4_4_ = local_138.d;
      local_e8.h = local_138.h;
      local_e8.d = local_138.d;
      local_e8.c = local_138.c;
      local_e8.cstep = local_138.cstep;
      uVar22 = uVar6;
      uVar24 = uVar7;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        uVar22 = local_e8._40_8_;
        uVar24 = local_e8._48_8_;
        if (*piVar1 == 0) {
          if (local_138.allocator == (Allocator *)0x0) {
            if (local_138.data != (void *)0x0) {
              local_e8._40_8_ = uVar6;
              local_e8._48_8_ = uVar7;
              free(local_138.data);
              uVar22 = local_e8._40_8_;
              uVar24 = local_e8._48_8_;
            }
          }
          else {
            local_e8._40_8_ = uVar6;
            local_e8._48_8_ = uVar7;
            (*(local_138.allocator)->_vptr_Allocator[3])();
            uVar22 = local_e8._40_8_;
            uVar24 = local_e8._48_8_;
          }
        }
      }
      local_e8._48_8_ = uVar24;
      local_e8._40_8_ = uVar22;
      local_138.cstep = 0;
      local_138.data = (void *)0x0;
      local_138.refcount._0_4_ = 0;
      local_138.refcount._4_4_ = 0;
      local_138.elemsize._0_4_ = 0;
      local_138.elemsize._4_4_ = 0;
      local_138.elempack = 0;
      local_138.dims = 0;
      local_138.w = 0;
      local_138.h = 0;
      local_138.d = 0;
      local_138.c = 0;
      uVar29 = (uint)local_f0;
    }
    if ((uVar29 == 4) && (pMVar32->dims == 3)) {
      in_R8 = (Option *)(ulong)(uint)pMVar32->h;
      Mat::reshape(&local_138,pMVar32,1,pMVar32->w,pMVar32->h,pMVar32->c,opt->workspace_allocator);
      piVar1 = (int *)CONCAT44(local_138.refcount._4_4_,local_138.refcount._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      piVar1 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (local_e8.allocator == (Allocator *)0x0) {
            if (local_e8.data != (void *)0x0) {
              free(local_e8.data);
            }
          }
          else {
            (*(local_e8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar1 = (int *)CONCAT44(local_138.refcount._4_4_,local_138.refcount._0_4_);
      local_e8.data = local_138.data;
      local_e8.refcount._0_4_ = local_138.refcount._0_4_;
      local_e8.refcount._4_4_ = local_138.refcount._4_4_;
      local_e8.elemsize._0_4_ = (undefined4)local_138.elemsize;
      local_e8.elemsize._4_4_ = local_138.elemsize._4_4_;
      local_e8.elempack = local_138.elempack;
      local_e8.allocator = local_138.allocator;
      uVar8._0_4_ = local_138.dims;
      uVar8._4_4_ = local_138.w;
      local_e8.dims = local_138.dims;
      local_e8.w = local_138.w;
      uVar9._0_4_ = local_138.h;
      uVar9._4_4_ = local_138.d;
      local_e8.h = local_138.h;
      local_e8.d = local_138.d;
      local_e8.c = local_138.c;
      local_e8.cstep = local_138.cstep;
      uVar22 = uVar8;
      uVar24 = uVar9;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        uVar22 = local_e8._40_8_;
        uVar24 = local_e8._48_8_;
        if (*piVar1 == 0) {
          if (local_138.allocator == (Allocator *)0x0) {
            if (local_138.data != (void *)0x0) {
              local_e8._40_8_ = uVar8;
              local_e8._48_8_ = uVar9;
              free(local_138.data);
              uVar22 = local_e8._40_8_;
              uVar24 = local_e8._48_8_;
            }
          }
          else {
            local_e8._40_8_ = uVar8;
            local_e8._48_8_ = uVar9;
            (*(local_138.allocator)->_vptr_Allocator[3])();
            uVar22 = local_e8._40_8_;
            uVar24 = local_e8._48_8_;
          }
        }
      }
      local_e8._48_8_ = uVar24;
      local_e8._40_8_ = uVar22;
      local_138.cstep = 0;
      local_138.data = (void *)0x0;
      local_138.refcount._0_4_ = 0;
      local_138.refcount._4_4_ = 0;
      local_138.elemsize._0_4_ = 0;
      local_138.elemsize._4_4_ = 0;
      local_138.elempack = 0;
      local_138.dims = 0;
      local_138.w = 0;
      local_138.h = 0;
      local_138.d = 0;
      local_138.c = 0;
      uVar29 = (uint)local_f0;
    }
  }
  local_48 = (Mat *)top_blobs;
  if (pMVar32[1].dims < (int)uVar29) {
    pMVar31 = pMVar32 + 1;
    if (uVar29 == 2) {
      sVar28 = (long)pMVar32[1].elempack * (long)pMVar32[1].w;
      iVar27 = (int)sVar28;
      if (iVar27 == pMVar32->elempack * pMVar32->h) {
        in_R8 = (Option *)opt->workspace_allocator;
        Mat::reshape(&local_138,pMVar31,1,pMVar32[1].w,(Allocator *)in_R8);
        piVar1 = (int *)CONCAT44(local_138.refcount._4_4_,local_138.refcount._0_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        piVar1 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            if (local_98.allocator == (Allocator *)0x0) {
              if (local_98.data != (void *)0x0) {
                free(local_98.data);
              }
            }
            else {
              (*(local_98.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        piVar1 = (int *)CONCAT44(local_138.refcount._4_4_,local_138.refcount._0_4_);
        local_98.data = local_138.data;
        local_98.refcount._0_4_ = local_138.refcount._0_4_;
        local_98.refcount._4_4_ = local_138.refcount._4_4_;
        local_98.elemsize._0_4_ = (undefined4)local_138.elemsize;
        local_98.elemsize._4_4_ = local_138.elemsize._4_4_;
        local_98.elempack = local_138.elempack;
        local_98.allocator = local_138.allocator;
        uVar10._0_4_ = local_138.dims;
        uVar10._4_4_ = local_138.w;
        local_98.dims = local_138.dims;
        local_98.w = local_138.w;
        uVar11._0_4_ = local_138.h;
        uVar11._4_4_ = local_138.d;
        local_98.h = local_138.h;
        local_98.d = local_138.d;
        local_98.c = local_138.c;
        local_98.cstep = local_138.cstep;
        uVar22 = uVar10;
        uVar24 = uVar11;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          uVar22 = local_98._40_8_;
          uVar24 = local_98._48_8_;
          if (*piVar1 == 0) {
            if (local_138.allocator == (Allocator *)0x0) {
              if (local_138.data != (void *)0x0) {
                local_98._40_8_ = uVar10;
                local_98._48_8_ = uVar11;
                free(local_138.data);
                uVar22 = local_98._40_8_;
                uVar24 = local_98._48_8_;
              }
            }
            else {
              local_98._40_8_ = uVar10;
              local_98._48_8_ = uVar11;
              (*(local_138.allocator)->_vptr_Allocator[3])();
              uVar22 = local_98._40_8_;
              uVar24 = local_98._48_8_;
            }
          }
        }
        local_98._48_8_ = uVar24;
        local_98._40_8_ = uVar22;
        local_138.cstep = 0;
        local_138.data = (void *)0x0;
        local_138.refcount._0_4_ = 0;
        local_138.refcount._4_4_ = 0;
        local_138.elemsize._0_4_ = 0;
        local_138.elemsize._4_4_ = 0;
        local_138.elempack = 0;
        local_138.dims = 0;
        local_138.w = 0;
        local_138.h = 0;
        local_138.d = 0;
        local_138.c = 0;
      }
      else {
        local_98.w = iVar27;
        local_98.dims = 2;
        local_98.elempack = 1;
        local_98.elemsize = pMVar32[1].elemsize / (ulong)(long)pMVar32[1].elempack;
        local_98.cstep = sVar28;
      }
      uVar29 = (uint)local_f0;
    }
    if ((uVar29 == 3) && (pMVar32[1].dims == 1)) {
      in_R8 = (Option *)(long)pMVar32[1].w;
      sVar28 = (long)pMVar32[1].elempack * (long)in_R8;
      iVar27 = (int)sVar28;
      if (iVar27 == pMVar32->elempack * pMVar32->c) {
        Mat::reshape(&local_138,pMVar31,1,1,pMVar32[1].w,opt->workspace_allocator);
        piVar1 = (int *)CONCAT44(local_138.refcount._4_4_,local_138.refcount._0_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        piVar1 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            if (local_98.allocator == (Allocator *)0x0) {
              if (local_98.data != (void *)0x0) {
                free(local_98.data);
              }
            }
            else {
              (*(local_98.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        piVar1 = (int *)CONCAT44(local_138.refcount._4_4_,local_138.refcount._0_4_);
        local_98.data = local_138.data;
        local_98.refcount._0_4_ = local_138.refcount._0_4_;
        local_98.refcount._4_4_ = local_138.refcount._4_4_;
        local_98.elemsize._0_4_ = (undefined4)local_138.elemsize;
        local_98.elemsize._4_4_ = local_138.elemsize._4_4_;
        local_98.elempack = local_138.elempack;
        local_98.allocator = local_138.allocator;
        uVar12._0_4_ = local_138.dims;
        uVar12._4_4_ = local_138.w;
        local_98.dims = local_138.dims;
        local_98.w = local_138.w;
        uVar13._0_4_ = local_138.h;
        uVar13._4_4_ = local_138.d;
        local_98.h = local_138.h;
        local_98.d = local_138.d;
        local_98.c = local_138.c;
        local_98.cstep = local_138.cstep;
        uVar22 = uVar12;
        uVar24 = uVar13;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          uVar22 = local_98._40_8_;
          uVar24 = local_98._48_8_;
          if (*piVar1 == 0) {
            if (local_138.allocator == (Allocator *)0x0) {
              if (local_138.data != (void *)0x0) {
                local_98._40_8_ = uVar12;
                local_98._48_8_ = uVar13;
                free(local_138.data);
                uVar22 = local_98._40_8_;
                uVar24 = local_98._48_8_;
              }
            }
            else {
              local_98._40_8_ = uVar12;
              local_98._48_8_ = uVar13;
              (*(local_138.allocator)->_vptr_Allocator[3])();
              uVar22 = local_98._40_8_;
              uVar24 = local_98._48_8_;
            }
          }
        }
        local_98._48_8_ = uVar24;
        local_98._40_8_ = uVar22;
        local_138.cstep = 0;
        local_138.data = (void *)0x0;
        local_138.refcount._0_4_ = 0;
        local_138.refcount._4_4_ = 0;
        local_138.elemsize._0_4_ = 0;
        local_138.elemsize._4_4_ = 0;
        local_138.elempack = 0;
        local_138.dims = 0;
        local_138.w = 0;
        local_138.h = 0;
        local_138.d = 0;
        local_138.c = 0;
      }
      else {
        local_98.w = iVar27;
        local_98.dims = 3;
        local_98.elempack = 1;
        local_98.elemsize = pMVar32[1].elemsize / (ulong)(long)pMVar32[1].elempack;
        local_98.cstep = sVar28;
      }
      uVar29 = (uint)local_f0;
    }
    if ((uVar29 == 3) && (pMVar32[1].dims == 2)) {
      in_R8 = (Option *)(ulong)(uint)pMVar32[1].h;
      Mat::reshape(&local_138,pMVar31,1,pMVar32[1].w,pMVar32[1].h,opt->workspace_allocator);
      piVar1 = (int *)CONCAT44(local_138.refcount._4_4_,local_138.refcount._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      piVar1 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (local_98.allocator == (Allocator *)0x0) {
            if (local_98.data != (void *)0x0) {
              free(local_98.data);
            }
          }
          else {
            (*(local_98.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar1 = (int *)CONCAT44(local_138.refcount._4_4_,local_138.refcount._0_4_);
      local_98.data = local_138.data;
      local_98.refcount._0_4_ = local_138.refcount._0_4_;
      local_98.refcount._4_4_ = local_138.refcount._4_4_;
      local_98.elemsize._0_4_ = (undefined4)local_138.elemsize;
      local_98.elemsize._4_4_ = local_138.elemsize._4_4_;
      local_98.elempack = local_138.elempack;
      local_98.allocator = local_138.allocator;
      uVar14._0_4_ = local_138.dims;
      uVar14._4_4_ = local_138.w;
      local_98.dims = local_138.dims;
      local_98.w = local_138.w;
      uVar15._0_4_ = local_138.h;
      uVar15._4_4_ = local_138.d;
      local_98.h = local_138.h;
      local_98.d = local_138.d;
      local_98.c = local_138.c;
      local_98.cstep = local_138.cstep;
      uVar22 = uVar14;
      uVar24 = uVar15;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        uVar22 = local_98._40_8_;
        uVar24 = local_98._48_8_;
        if (*piVar1 == 0) {
          if (local_138.allocator == (Allocator *)0x0) {
            if (local_138.data != (void *)0x0) {
              local_98._40_8_ = uVar14;
              local_98._48_8_ = uVar15;
              free(local_138.data);
              uVar22 = local_98._40_8_;
              uVar24 = local_98._48_8_;
            }
          }
          else {
            local_98._40_8_ = uVar14;
            local_98._48_8_ = uVar15;
            (*(local_138.allocator)->_vptr_Allocator[3])();
            uVar22 = local_98._40_8_;
            uVar24 = local_98._48_8_;
          }
        }
      }
      local_98._48_8_ = uVar24;
      local_98._40_8_ = uVar22;
      local_138.cstep = 0;
      local_138.data = (void *)0x0;
      local_138.refcount._0_4_ = 0;
      local_138.refcount._4_4_ = 0;
      local_138.elemsize._0_4_ = 0;
      local_138.elemsize._4_4_ = 0;
      local_138.elempack = 0;
      local_138.dims = 0;
      local_138.w = 0;
      local_138.h = 0;
      local_138.d = 0;
      local_138.c = 0;
      uVar29 = (uint)local_f0;
    }
    if ((uVar29 == 4) && (pMVar32[1].dims == 1)) {
      sVar28 = (long)pMVar32[1].elempack * (long)pMVar32[1].w;
      iVar27 = (int)sVar28;
      if (iVar27 == pMVar32->elempack * pMVar32->c) {
        in_R8 = (Option *)0x1;
        Mat::reshape(&local_138,pMVar31,1,1,1,pMVar32[1].w,opt->workspace_allocator);
        piVar1 = (int *)CONCAT44(local_138.refcount._4_4_,local_138.refcount._0_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        piVar1 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            if (local_98.allocator == (Allocator *)0x0) {
              if (local_98.data != (void *)0x0) {
                free(local_98.data);
              }
            }
            else {
              (*(local_98.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        piVar1 = (int *)CONCAT44(local_138.refcount._4_4_,local_138.refcount._0_4_);
        local_98.data = local_138.data;
        local_98.refcount._0_4_ = local_138.refcount._0_4_;
        local_98.refcount._4_4_ = local_138.refcount._4_4_;
        local_98.elemsize._0_4_ = (undefined4)local_138.elemsize;
        local_98.elemsize._4_4_ = local_138.elemsize._4_4_;
        local_98.elempack = local_138.elempack;
        local_98.allocator = local_138.allocator;
        uVar16._0_4_ = local_138.dims;
        uVar16._4_4_ = local_138.w;
        local_98.dims = local_138.dims;
        local_98.w = local_138.w;
        uVar17._0_4_ = local_138.h;
        uVar17._4_4_ = local_138.d;
        local_98.h = local_138.h;
        local_98.d = local_138.d;
        local_98.c = local_138.c;
        local_98.cstep = local_138.cstep;
        uVar22 = uVar16;
        uVar24 = uVar17;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          uVar22 = local_98._40_8_;
          uVar24 = local_98._48_8_;
          if (*piVar1 == 0) {
            if (local_138.allocator == (Allocator *)0x0) {
              if (local_138.data != (void *)0x0) {
                local_98._40_8_ = uVar16;
                local_98._48_8_ = uVar17;
                free(local_138.data);
                uVar22 = local_98._40_8_;
                uVar24 = local_98._48_8_;
              }
            }
            else {
              local_98._40_8_ = uVar16;
              local_98._48_8_ = uVar17;
              (*(local_138.allocator)->_vptr_Allocator[3])();
              uVar22 = local_98._40_8_;
              uVar24 = local_98._48_8_;
            }
          }
        }
        local_98._48_8_ = uVar24;
        local_98._40_8_ = uVar22;
        local_138.cstep = 0;
        local_138.data = (void *)0x0;
        local_138.refcount._0_4_ = 0;
        local_138.refcount._4_4_ = 0;
        local_138.elemsize._0_4_ = 0;
        local_138.elemsize._4_4_ = 0;
        local_138.elempack = 0;
        local_138.dims = 0;
        local_138.w = 0;
        local_138.h = 0;
        local_138.d = 0;
        local_138.c = 0;
      }
      else {
        local_98.w = iVar27;
        local_98.dims = 4;
        local_98.elempack = 1;
        local_98.elemsize = pMVar32[1].elemsize / (ulong)(long)pMVar32[1].elempack;
        local_98.cstep = sVar28;
      }
      uVar29 = (uint)local_f0;
    }
    if ((uVar29 == 4) && (pMVar32[1].dims == 2)) {
      in_R8 = (Option *)(ulong)(uint)pMVar32[1].w;
      Mat::reshape(&local_138,pMVar31,1,1,pMVar32[1].w,pMVar32[1].h,opt->workspace_allocator);
      piVar1 = (int *)CONCAT44(local_138.refcount._4_4_,local_138.refcount._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      piVar1 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (local_98.allocator == (Allocator *)0x0) {
            if (local_98.data != (void *)0x0) {
              free(local_98.data);
            }
          }
          else {
            (*(local_98.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar1 = (int *)CONCAT44(local_138.refcount._4_4_,local_138.refcount._0_4_);
      local_98.data = local_138.data;
      local_98.refcount._0_4_ = local_138.refcount._0_4_;
      local_98.refcount._4_4_ = local_138.refcount._4_4_;
      local_98.elemsize._0_4_ = (undefined4)local_138.elemsize;
      local_98.elemsize._4_4_ = local_138.elemsize._4_4_;
      local_98.elempack = local_138.elempack;
      local_98.allocator = local_138.allocator;
      uVar18._0_4_ = local_138.dims;
      uVar18._4_4_ = local_138.w;
      local_98.dims = local_138.dims;
      local_98.w = local_138.w;
      uVar19._0_4_ = local_138.h;
      uVar19._4_4_ = local_138.d;
      local_98.h = local_138.h;
      local_98.d = local_138.d;
      local_98.c = local_138.c;
      local_98.cstep = local_138.cstep;
      uVar22 = uVar18;
      uVar24 = uVar19;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        uVar22 = local_98._40_8_;
        uVar24 = local_98._48_8_;
        if (*piVar1 == 0) {
          if (local_138.allocator == (Allocator *)0x0) {
            if (local_138.data != (void *)0x0) {
              local_98._40_8_ = uVar18;
              local_98._48_8_ = uVar19;
              free(local_138.data);
              uVar22 = local_98._40_8_;
              uVar24 = local_98._48_8_;
            }
          }
          else {
            local_98._40_8_ = uVar18;
            local_98._48_8_ = uVar19;
            (*(local_138.allocator)->_vptr_Allocator[3])();
            uVar22 = local_98._40_8_;
            uVar24 = local_98._48_8_;
          }
        }
      }
      local_98._48_8_ = uVar24;
      local_98._40_8_ = uVar22;
      local_138.cstep = 0;
      local_138.data = (void *)0x0;
      local_138.refcount._0_4_ = 0;
      local_138.refcount._4_4_ = 0;
      local_138.elemsize._0_4_ = 0;
      local_138.elemsize._4_4_ = 0;
      local_138.elempack = 0;
      local_138.dims = 0;
      local_138.w = 0;
      local_138.h = 0;
      local_138.d = 0;
      local_138.c = 0;
      uVar29 = (uint)local_f0;
    }
    if ((uVar29 == 4) && (pMVar32[1].dims == 3)) {
      in_R8 = (Option *)(ulong)(uint)pMVar32[1].h;
      Mat::reshape(&local_138,pMVar31,1,pMVar32[1].w,pMVar32[1].h,pMVar32[1].c,
                   opt->workspace_allocator);
      piVar1 = (int *)CONCAT44(local_138.refcount._4_4_,local_138.refcount._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      piVar1 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (local_98.allocator == (Allocator *)0x0) {
            if (local_98.data != (void *)0x0) {
              free(local_98.data);
            }
          }
          else {
            (*(local_98.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar1 = (int *)CONCAT44(local_138.refcount._4_4_,local_138.refcount._0_4_);
      local_98.data = local_138.data;
      local_98.refcount._0_4_ = local_138.refcount._0_4_;
      local_98.refcount._4_4_ = local_138.refcount._4_4_;
      local_98.elemsize._0_4_ = (undefined4)local_138.elemsize;
      local_98.elemsize._4_4_ = local_138.elemsize._4_4_;
      local_98.elempack = local_138.elempack;
      local_98.allocator = local_138.allocator;
      uVar20._0_4_ = local_138.dims;
      uVar20._4_4_ = local_138.w;
      local_98.dims = local_138.dims;
      local_98.w = local_138.w;
      uVar21._0_4_ = local_138.h;
      uVar21._4_4_ = local_138.d;
      local_98.h = local_138.h;
      local_98.d = local_138.d;
      local_98.c = local_138.c;
      local_98.cstep = local_138.cstep;
      uVar22 = uVar20;
      uVar24 = uVar21;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        uVar22 = local_98._40_8_;
        uVar24 = local_98._48_8_;
        if (*piVar1 == 0) {
          if (local_138.allocator == (Allocator *)0x0) {
            if (local_138.data != (void *)0x0) {
              local_98._40_8_ = uVar20;
              local_98._48_8_ = uVar21;
              free(local_138.data);
              uVar22 = local_98._40_8_;
              uVar24 = local_98._48_8_;
            }
          }
          else {
            local_98._40_8_ = uVar20;
            local_98._48_8_ = uVar21;
            (*(local_138.allocator)->_vptr_Allocator[3])();
            uVar22 = local_98._40_8_;
            uVar24 = local_98._48_8_;
          }
        }
      }
      local_98._48_8_ = uVar24;
      local_98._40_8_ = uVar22;
      local_138.cstep = 0;
      local_138.data = (void *)0x0;
      local_138.refcount._0_4_ = 0;
      local_138.refcount._4_4_ = 0;
      local_138.elemsize._0_4_ = 0;
      local_138.elemsize._4_4_ = 0;
      local_138.elempack = 0;
      local_138.dims = 0;
      local_138.w = 0;
      local_138.h = 0;
      local_138.d = 0;
      local_138.c = 0;
      uVar29 = (uint)local_f0;
    }
  }
  iVar27 = local_98.w;
  if (local_98.w < local_e8.w) {
    iVar27 = local_e8.w;
  }
  _h = local_98.h;
  if (local_98.h < local_e8.h) {
    _h = local_e8.h;
  }
  _d = local_98.d;
  if (local_98.d < local_e8.d) {
    _d = local_e8.d;
  }
  _c = local_98.c;
  if (local_98.c < local_e8.c) {
    _c = local_e8.c;
  }
  pOVar30 = (Option *)(ulong)_c;
  _elemsize = (Option *)local_98.elemsize;
  if (local_98.elemsize < local_e8.elemsize) {
    _elemsize = (Option *)local_e8.elemsize;
  }
  _elempack = local_98.elempack;
  if (local_98.elempack < local_e8.elempack) {
    _elempack = local_e8.elempack;
  }
  pOVar33 = (Option *)(ulong)_elempack;
  pMVar32 = (Mat *)local_48->data;
  local_40 = opt;
  local_38 = this;
  switch(uVar29) {
  case 1:
    in_R8 = (Option *)opt->blob_allocator;
    local_48 = pMVar32;
    Mat::create(pMVar32,iVar27,(size_t)_elemsize,_elempack,(Allocator *)in_R8);
    iVar26 = (int)local_f0;
    pMVar32 = local_48;
    if (iVar26 == 4) goto switchD_003c6d27_caseD_4;
    if (iVar26 == 3) goto switchD_003c6d27_caseD_3;
    if (iVar26 == 2) goto switchD_003c6d27_caseD_2;
    break;
  case 2:
switchD_003c6d27_caseD_2:
    local_48 = pMVar32;
    Mat::create(local_48,iVar27,_h,(size_t)_elemsize,_elempack,local_40->blob_allocator);
    pMVar32 = local_48;
    if ((int)local_f0 == 4) goto switchD_003c6d27_caseD_4;
    in_R8 = pOVar33;
    if ((int)local_f0 == 3) goto switchD_003c6d27_caseD_3;
    break;
  case 3:
switchD_003c6d27_caseD_3:
    local_48 = pMVar32;
    in_R8 = _elemsize;
    Mat::create(local_48,iVar27,_h,_c,(size_t)_elemsize,_elempack,local_40->blob_allocator);
    pMVar32 = local_48;
    if ((int)local_f0 == 4) goto switchD_003c6d27_caseD_4;
    break;
  case 4:
switchD_003c6d27_caseD_4:
    local_48 = pMVar32;
    Mat::create(local_48,iVar27,_h,_d,_c,(size_t)_elemsize,_elempack,local_40->blob_allocator);
    in_R8 = pOVar30;
    pMVar32 = local_48;
  }
  iVar27 = -100;
  if ((pMVar32->data == (void *)0x0) || ((long)pMVar32->c * pMVar32->cstep == 0)) goto LAB_003c6ef4;
  if (local_e8.elempack < local_98.elempack) {
LAB_003c6e87:
    iVar27 = (local_38->super_BinaryOp).op_type;
    uVar29 = iVar27 - 1;
    if ((uVar29 < 0xb) && ((0x7e5U >> (uVar29 & 0x1f) & 1) != 0)) {
      iVar27 = *(int *)(&DAT_005fd5ec + (ulong)uVar29 * 4);
    }
    a = &local_98;
    pMVar31 = &local_e8;
  }
  else {
    if (local_e8.elempack == local_98.elempack) {
      if (local_e8.elempack * local_e8.w * local_e8.h * local_e8.d * local_e8.c <
          local_98.elempack * local_98.w * local_98.h * local_98.d * local_98.c) goto LAB_003c6e87;
    }
    iVar27 = (local_38->super_BinaryOp).op_type;
    a = &local_e8;
    pMVar31 = &local_98;
  }
  binary_op_broadcast(a,pMVar31,pMVar32,iVar27,in_R8);
  iVar27 = 0;
LAB_003c6ef4:
  piVar1 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_98.allocator == (Allocator *)0x0) {
        if (local_98.data != (void *)0x0) {
          free(local_98.data);
        }
      }
      else {
        (*(local_98.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_98.cstep = 0;
  local_98.data = (void *)0x0;
  local_98.refcount._0_4_ = 0;
  local_98.refcount._4_4_ = 0;
  local_98.elemsize._0_4_ = 0;
  local_98.elemsize._4_4_ = 0;
  local_98.elempack = 0;
  local_98.dims = 0;
  local_98.w = 0;
  local_98.h = 0;
  local_98.d = 0;
  local_98.c = 0;
  piVar1 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_e8.allocator == (Allocator *)0x0) {
        if (local_e8.data != (void *)0x0) {
          free(local_e8.data);
        }
      }
      else {
        (*(local_e8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar27;
}

Assistant:

int BinaryOp_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& A = bottom_blobs[0];
    const Mat& B = bottom_blobs[1];
    const int outdims = std::max(A.dims, B.dims);

    Mat A2 = A;
    Mat B2 = B;
    if (A.dims < outdims)
    {
        // expand inner axes
        if (outdims == 2)
        {
            if (A.w * A.elempack == B.h * B.elempack)
                A2 = A.reshape(1, A.w, opt.workspace_allocator);
            else // if (A.w == B.w)
            {
                A2.dims = 2;
                A2.w = A.w * A.elempack;
                A2.elempack = 1;
                A2.elemsize = A.elemsize / A.elempack;
                A2.cstep = A2.w;
            }
        }
        if (outdims == 3 && A.dims == 1)
        {
            if (A.w * A.elempack == B.c * B.elempack)
                A2 = A.reshape(1, 1, A.w, opt.workspace_allocator);
            else // if (A.w == B.w)
            {
                A2.dims = 3;
                A2.w = A.w * A.elempack;
                A2.elempack = 1;
                A2.elemsize = A.elemsize / A.elempack;
                A2.cstep = A2.w;
            }
        }
        if (outdims == 3 && A.dims == 2)
            A2 = A.reshape(1, A.w, A.h, opt.workspace_allocator);
        if (outdims == 4 && A.dims == 1)
        {
            if (A.w * A.elempack == B.c * B.elempack)
                A2 = A.reshape(1, 1, 1, A.w, opt.workspace_allocator);
            else // if (A.w == B.w)
            {
                A2.dims = 4;
                A2.w = A.w * A.elempack;
                A2.elempack = 1;
                A2.elemsize = A.elemsize / A.elempack;
                A2.cstep = A2.w;
            }
        }
        if (outdims == 4 && A.dims == 2)
            A2 = A.reshape(1, 1, A.w, A.h, opt.workspace_allocator);
        if (outdims == 4 && A.dims == 3)
            A2 = A.reshape(1, A.w, A.h, A.c, opt.workspace_allocator);
    }
    if (B.dims < outdims)
    {
        // expand inner axes
        if (outdims == 2)
        {
            if (B.w * B.elempack == A.h * A.elempack)
                B2 = B.reshape(1, B.w, opt.workspace_allocator);
            else // if (B.w == A.w)
            {
                B2.dims = 2;
                B2.w = B.w * B.elempack;
                B2.elempack = 1;
                B2.elemsize = B.elemsize / B.elempack;
                B2.cstep = B2.w;
            }
        }
        if (outdims == 3 && B.dims == 1)
        {
            if (B.w * B.elempack == A.c * A.elempack)
                B2 = B.reshape(1, 1, B.w, opt.workspace_allocator);
            else // if (B.w == A.w)
            {
                B2.dims = 3;
                B2.w = B.w * B.elempack;
                B2.elempack = 1;
                B2.elemsize = B.elemsize / B.elempack;
                B2.cstep = B2.w;
            }
        }
        if (outdims == 3 && B.dims == 2)
            B2 = B.reshape(1, B.w, B.h, opt.workspace_allocator);
        if (outdims == 4 && B.dims == 1)
        {
            if (B.w * B.elempack == A.c * A.elempack)
                B2 = B.reshape(1, 1, 1, B.w, opt.workspace_allocator);
            else // if (B.w == A.w)
            {
                B2.dims = 4;
                B2.w = B.w * B.elempack;
                B2.elempack = 1;
                B2.elemsize = B.elemsize / B.elempack;
                B2.cstep = B2.w;
            }
        }
        if (outdims == 4 && B.dims == 2)
            B2 = B.reshape(1, 1, B.w, B.h, opt.workspace_allocator);
        if (outdims == 4 && B.dims == 3)
            B2 = B.reshape(1, B.w, B.h, B.c, opt.workspace_allocator);
    }

    const int outw = std::max(A2.w, B2.w);
    const int outh = std::max(A2.h, B2.h);
    const int outd = std::max(A2.d, B2.d);
    const int outc = std::max(A2.c, B2.c);
    const size_t out_elemsize = std::max(A2.elemsize, B2.elemsize);
    const int out_elempack = std::max(A2.elempack, B2.elempack);

    Mat& top_blob = top_blobs[0];
    if (outdims == 1)
    {
        top_blob.create(outw, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (outdims == 2)
    {
        top_blob.create(outw, outh, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (outdims == 3)
    {
        top_blob.create(outw, outh, outc, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (outdims == 4)
    {
        top_blob.create(outw, outh, outd, outc, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    const bool a_pack_is_lower = A2.elempack < B2.elempack;
    const bool a_pack_is_equal = A2.elempack == B2.elempack;
    const bool a_size_is_lower = A2.w * A2.h * A2.d * A2.c * A2.elempack < B2.w * B2.h * B2.d * B2.c * B2.elempack;
    if (a_pack_is_lower || (a_pack_is_equal && a_size_is_lower))
    {
        binary_op_broadcast(B2, A2, top_blob, get_reverse_op_type(op_type), opt);
    }
    else
    {
        binary_op_broadcast(A2, B2, top_blob, op_type, opt);
    }

    return 0;
}